

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O3

int CfdGetPegoutAddress(void *handle,int mainchain_network,int elements_network,char *descriptor,
                       uint32_t bip32_counter,int address_type,char **mainchain_address,
                       char **base_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  NetType mainchain_network_00;
  NetType elements_network_00;
  AddressType address_type_00;
  char *pcVar3;
  char *pcVar4;
  CfdException *this;
  char *work_address;
  Address addr;
  Descriptor desc;
  allocator local_349;
  void *local_348;
  string local_340;
  char *local_320;
  undefined8 local_318;
  undefined1 local_310 [32];
  char local_2f0 [16];
  pointer local_2e0;
  pointer local_2c8;
  pointer local_2b0;
  TapBranch local_298;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_220;
  Script local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  DescriptorNode local_198;
  
  local_320 = (char *)0x0;
  local_318 = 0;
  local_348 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(descriptor);
  if (!bVar2) {
    mainchain_network_00 = cfd::capi::ConvertNetType(mainchain_network,(bool *)0x0);
    elements_network_00 = cfd::capi::ConvertNetType(elements_network,(bool *)0x0);
    address_type_00 = cfd::capi::ConvertAddressType(0);
    cfd::core::Descriptor::Descriptor((Descriptor *)&local_198);
    std::__cxx11::string::string((string *)&local_340,descriptor,&local_349);
    cfd::ElementsAddressFactory::CreatePegOutAddress
              ((Address *)local_310,mainchain_network_00,elements_network_00,&local_340,
               bip32_counter,address_type_00,(Descriptor *)&local_198);
    paVar1 = &local_340.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar1) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if (mainchain_address == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_340,(Address *)local_310);
      pcVar3 = cfd::capi::CreateString(&local_340);
      local_320 = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p);
      }
    }
    if (base_descriptor != (char **)0x0) {
      cfd::core::Descriptor::ToString_abi_cxx11_(&local_340,(Descriptor *)&local_198,false);
      pcVar4 = cfd::capi::CreateString(&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      *base_descriptor = pcVar4;
    }
    if (mainchain_address != (char **)0x0) {
      *mainchain_address = pcVar3;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c8);
    cfd::core::Script::~Script(&local_208);
    local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_220);
    cfd::core::TapBranch::~TapBranch(&local_298);
    if (local_2b0 != (pointer)0x0) {
      operator_delete(local_2b0);
    }
    if (local_2c8 != (pointer)0x0) {
      operator_delete(local_2c8);
    }
    if (local_2e0 != (pointer)0x0) {
      operator_delete(local_2e0);
    }
    if ((char *)local_310._16_8_ != local_2f0) {
      operator_delete((void *)local_310._16_8_);
    }
    cfd::core::DescriptorNode::~DescriptorNode(&local_198);
    return 0;
  }
  local_310._0_8_ = "cfdcapi_elements_address.cpp";
  local_310._8_4_ = 0xf8;
  local_310._16_8_ = "CfdGetPegoutAddress";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_310,kCfdLogLevelWarning,"descriptor is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_310._0_8_ = local_310 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"Failed to parameter. descriptor is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_310);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPegoutAddress(
    void* handle, int mainchain_network, int elements_network,
    const char* descriptor, uint32_t bip32_counter, int address_type,
    char** mainchain_address, char** base_descriptor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_descriptor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }

    auto mainchain_net_type = ConvertNetType(mainchain_network, nullptr);
    auto elements_net_type = ConvertNetType(elements_network, nullptr);
    auto addr_type = ConvertAddressType(address_type);
    Descriptor desc;
    auto addr = ElementsAddressFactory::CreatePegOutAddress(
        mainchain_net_type, elements_net_type, descriptor, bip32_counter,
        addr_type, &desc);
    if (mainchain_address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (base_descriptor != nullptr) {
      work_descriptor = CreateString(desc.ToString(false));
    }

    if (base_descriptor != nullptr) *base_descriptor = work_descriptor;
    if (mainchain_address != nullptr) *mainchain_address = work_address;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_descriptor);
  return result;
}